

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O0

NumberParserImpl *
icu_63::numparse::impl::NumberParserImpl::createParserFromProperties
          (DecimalFormatProperties *properties,DecimalFormatSymbols *symbols,bool parseCurrency,
          UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  int16_t iVar3;
  ParseMode PVar4;
  uint uVar5;
  CurrencyPluralInfo *cpi;
  NumberParserImpl *pNVar6;
  NumberParserImpl *pNVar7;
  CombinedCurrencyMatcher *pCVar8;
  PercentMatcher *pPVar9;
  PermilleMatcher *pPVar10;
  PlusSignMatcher *pPVar11;
  MinusSignMatcher *pMVar12;
  NanMatcher *pNVar13;
  InfinityMatcher *pIVar14;
  UnicodeSet *this;
  PaddingMatcher *pPVar15;
  DecimalMatcher *pDVar16;
  ScientificMatcher *pSVar17;
  RequireNumberValidator *pRVar18;
  RequireAffixValidator *pRVar19;
  RequireCurrencyValidator *pRVar20;
  RequireDecimalSeparatorValidator *pRVar21;
  MultiplierParseHandler *pMVar22;
  size_t size;
  Grouper GVar23;
  bool local_1c39;
  NumberParserImpl *local_1ac0;
  Scale local_1a88;
  MultiplierParseHandler local_1a70;
  undefined1 local_1a50 [8];
  Scale multiplier;
  NumberParseMatcher NStack_1a20;
  bool patternHasDecimalSeparator;
  NumberParseMatcher local_1a18;
  NumberParseMatcher local_1a10;
  ScientificMatcher local_1a08;
  DecimalMatcher local_1878;
  PaddingMatcher local_17b0;
  undefined1 local_1760 [8];
  UnicodeString padString;
  NanMatcher local_16d0;
  MinusSignMatcher local_1680;
  PlusSignMatcher local_1628;
  PermilleMatcher local_15d0;
  PercentMatcher local_1580;
  CombinedCurrencyMatcher local_1530;
  AffixMatcherWarehouse local_1258;
  AffixTokenMatcherWarehouse local_f50;
  undefined1 local_a98 [8];
  AffixTokenMatcherSetupData affixSetupData;
  IgnorablesMatcher *ignorables;
  undefined1 local_a11;
  NumberParserImpl *local_a10;
  LocalPointerBase<icu_63::numparse::impl::NumberParserImpl> local_a08;
  LocalPointer<icu_63::numparse::impl::NumberParserImpl> parser;
  int parseFlags;
  undefined1 local_9e8 [8];
  Grouper grouper;
  bool isStrict;
  undefined1 local_9b8 [8];
  CurrencySymbols currencySymbols;
  CurrencyUnit currency;
  AffixPatternProvider *local_8a8;
  AffixPatternProvider *affixProvider;
  CurrencyPluralInfoAffixProvider localCPIAP;
  undefined1 local_220 [8];
  PropertiesAffixPatternProvider localPAPP;
  Locale locale;
  UErrorCode *status_local;
  bool parseCurrency_local;
  DecimalFormatSymbols *symbols_local;
  DecimalFormatProperties *properties_local;
  
  DecimalFormatSymbols::getLocale((Locale *)&localPAPP.fBogus,symbols);
  icu_63::number::impl::PropertiesAffixPatternProvider::PropertiesAffixPatternProvider
            ((PropertiesAffixPatternProvider *)local_220);
  icu_63::number::impl::CurrencyPluralInfoAffixProvider::CurrencyPluralInfoAffixProvider
            ((CurrencyPluralInfoAffixProvider *)&affixProvider);
  UVar1 = LocalPointerBase<icu_63::CurrencyPluralInfo>::isNull
                    ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&properties->currencyPluralInfo
                    );
  if (UVar1 == '\0') {
    cpi = LocalPointerBase<icu_63::CurrencyPluralInfo>::operator*
                    ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&properties->currencyPluralInfo
                    );
    icu_63::number::impl::CurrencyPluralInfoAffixProvider::setTo
              ((CurrencyPluralInfoAffixProvider *)&affixProvider,cpi,properties,status);
    local_8a8 = (AffixPatternProvider *)&affixProvider;
  }
  else {
    icu_63::number::impl::PropertiesAffixPatternProvider::setTo
              ((PropertiesAffixPatternProvider *)local_220,properties,status);
    local_8a8 = (AffixPatternProvider *)local_220;
  }
  if ((local_8a8 == (AffixPatternProvider *)0x0) || (UVar1 = ::U_FAILURE(*status), UVar1 != '\0')) {
    properties_local = (DecimalFormatProperties *)0x0;
    goto LAB_002fcef8;
  }
  icu_63::number::impl::resolveCurrency
            ((CurrencyUnit *)((long)&currencySymbols.fIntlCurrencySymbol.fUnion + 0x30),properties,
             (Locale *)&localPAPP.fBogus,status);
  CurrencyUnit::CurrencyUnit
            ((CurrencyUnit *)&grouper.fStrategy,
             (CurrencyUnit *)((long)&currencySymbols.fIntlCurrencySymbol.fUnion + 0x30));
  icu_63::number::impl::CurrencySymbols::CurrencySymbols
            ((CurrencySymbols *)local_9b8,(CurrencyUnit *)&grouper.fStrategy,
             (Locale *)&localPAPP.fBogus,symbols,status);
  CurrencyUnit::~CurrencyUnit((CurrencyUnit *)&grouper.fStrategy);
  size = 1;
  PVar4 = icu_63::number::impl::NullableValue<icu_63::number::impl::ParseMode>::getOrDefault
                    (&properties->parseMode,PARSE_MODE_STRICT);
  grouper._7_1_ = PVar4 == PARSE_MODE_STRICT;
  GVar23 = icu_63::number::impl::Grouper::forProperties(properties);
  grouper._0_4_ = GVar23.fStrategy;
  local_9e8 = GVar23._0_8_;
  parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ = 0;
  if (local_8a8 == (AffixPatternProvider *)0x0) {
LAB_002fbd82:
    properties_local = (DecimalFormatProperties *)0x0;
  }
  else {
    UVar1 = ::U_FAILURE(*status);
    GVar23.fStrategy._0_2_ = grouper.fGrouping1;
    GVar23.fStrategy._2_2_ = grouper.fGrouping2;
    GVar23.fGrouping1 = local_9e8._0_2_;
    GVar23.fGrouping2 = local_9e8._2_2_;
    GVar23.fMinGrouping = local_9e8._4_2_;
    GVar23._6_2_ = local_9e8._6_2_;
    if (UVar1 != '\0') goto LAB_002fbd82;
    if ((properties->parseCaseSensitive & 1U) == 0) {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ | 1;
    }
    if ((properties->parseIntegerOnly & 1U) != 0) {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ | 0x10;
    }
    if ((properties->signAlwaysShown & 1U) != 0) {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ | 0x400
      ;
    }
    if ((grouper._7_1_ & 1) == 0) {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ | 0x80;
    }
    else {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ | 0x30c
      ;
    }
    iVar3 = icu_63::number::impl::Grouper::getPrimary((Grouper *)local_9e8);
    if (iVar3 < 1) {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ | 0x20;
    }
    if ((parseCurrency) || (uVar5 = (*local_8a8->_vptr_AffixPatternProvider[5])(), (uVar5 & 1) != 0)
       ) {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ | 2;
    }
    if (!parseCurrency) {
      parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ =
           parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_ |
           0x2000;
    }
    pNVar6 = (NumberParserImpl *)UMemory::operator_new((UMemory *)0x1040,size);
    local_a11 = 0;
    local_1ac0 = (NumberParserImpl *)0x0;
    if (pNVar6 != (NumberParserImpl *)0x0) {
      local_a11 = 1;
      local_a10 = pNVar6;
      NumberParserImpl(pNVar6,parser.
                              super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr.
                              _4_4_);
      local_1ac0 = pNVar6;
    }
    LocalPointer<icu_63::numparse::impl::NumberParserImpl>::LocalPointer
              ((LocalPointer<icu_63::numparse::impl::NumberParserImpl> *)&local_a08,local_1ac0);
    IgnorablesMatcher::IgnorablesMatcher
              ((IgnorablesMatcher *)&ignorables,((byte)grouper._7_1_ & 1) + DEFAULT_IGNORABLES);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    IgnorablesMatcher::operator=
              (&(pNVar6->fLocalMatchers).ignorables,(IgnorablesMatcher *)&ignorables);
    IgnorablesMatcher::~IgnorablesMatcher((IgnorablesMatcher *)&ignorables);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    affixSetupData.dfs = (DecimalFormatSymbols *)&pNVar6->fLocalMatchers;
    local_a98 = (undefined1  [8])local_9b8;
    affixSetupData.ignorables = (IgnorablesMatcher *)&localPAPP.fBogus;
    affixSetupData.locale._0_4_ =
         parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_;
    affixSetupData.currencySymbols = (CurrencySymbols *)symbols;
    affixSetupData._32_8_ = affixSetupData.dfs;
    AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
              (&local_f50,(AffixTokenMatcherSetupData *)local_a98);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    AffixTokenMatcherWarehouse::operator=
              (&(pNVar6->fLocalMatchers).affixTokenMatcherWarehouse,&local_f50);
    AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse(&local_f50);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    AffixMatcherWarehouse::AffixMatcherWarehouse
              (&local_1258,&(pNVar6->fLocalMatchers).affixTokenMatcherWarehouse);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    AffixMatcherWarehouse::operator=(&(pNVar6->fLocalMatchers).affixMatcherWarehouse,&local_1258);
    AffixMatcherWarehouse::~AffixMatcherWarehouse(&local_1258);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator*(&local_a08);
    AffixMatcherWarehouse::createAffixMatchers
              (&(pNVar6->fLocalMatchers).affixMatcherWarehouse,local_8a8,
               &pNVar7->super_MutableMatcherCollection,(IgnorablesMatcher *)affixSetupData._32_8_,
               parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_,
               status);
    if ((parseCurrency) || (uVar5 = (*local_8a8->_vptr_AffixPatternProvider[5])(), (uVar5 & 1) != 0)
       ) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      CombinedCurrencyMatcher::CombinedCurrencyMatcher
                (&local_1530,(CurrencySymbols *)local_9b8,symbols,
                 parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_,
                 status);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pCVar8 = CombinedCurrencyMatcher::operator=(&(pNVar7->fLocalMatchers).currency,&local_1530);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pCVar8);
      CombinedCurrencyMatcher::~CombinedCurrencyMatcher(&local_1530);
    }
    if (((grouper._7_1_ & 1) == 0) &&
       (uVar5 = (*local_8a8->_vptr_AffixPatternProvider[9])(local_8a8,0xfffffffd,status),
       (uVar5 & 1) != 0)) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      PercentMatcher::PercentMatcher(&local_1580,symbols);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pPVar9 = PercentMatcher::operator=(&(pNVar7->fLocalMatchers).percent,&local_1580);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pPVar9);
      PercentMatcher::~PercentMatcher(&local_1580);
    }
    if (((grouper._7_1_ & 1) == 0) &&
       (uVar5 = (*local_8a8->_vptr_AffixPatternProvider[9])(local_8a8,0xfffffffc,status),
       (uVar5 & 1) != 0)) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      PermilleMatcher::PermilleMatcher(&local_15d0,symbols);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pPVar10 = PermilleMatcher::operator=(&(pNVar7->fLocalMatchers).permille,&local_15d0);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pPVar10);
      PermilleMatcher::~PermilleMatcher(&local_15d0);
    }
    if ((grouper._7_1_ & 1) == 0) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      PlusSignMatcher::PlusSignMatcher(&local_1628,symbols,false);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pPVar11 = PlusSignMatcher::operator=(&(pNVar7->fLocalMatchers).plusSign,&local_1628);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pPVar11);
      PlusSignMatcher::~PlusSignMatcher(&local_1628);
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      MinusSignMatcher::MinusSignMatcher(&local_1680,symbols,false);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pMVar12 = MinusSignMatcher::operator=(&(pNVar7->fLocalMatchers).minusSign,&local_1680);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pMVar12);
      MinusSignMatcher::~MinusSignMatcher(&local_1680);
    }
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    NanMatcher::NanMatcher(&local_16d0,symbols);
    pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    pNVar13 = NanMatcher::operator=(&(pNVar7->fLocalMatchers).nan,&local_16d0);
    (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pNVar13);
    NanMatcher::~NanMatcher(&local_16d0);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    InfinityMatcher::InfinityMatcher((InfinityMatcher *)((long)&padString.fUnion + 0x30),symbols);
    pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    pIVar14 = InfinityMatcher::operator=
                        (&(pNVar7->fLocalMatchers).infinity,
                         (InfinityMatcher *)((long)&padString.fUnion + 0x30));
    (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pIVar14);
    InfinityMatcher::~InfinityMatcher((InfinityMatcher *)((long)&padString.fUnion + 0x30));
    UnicodeString::UnicodeString((UnicodeString *)local_1760,&properties->padString);
    UVar1 = UnicodeString::isBogus((UnicodeString *)local_1760);
    if (UVar1 == '\0') {
      this = SymbolMatcher::getSet((SymbolMatcher *)affixSetupData._32_8_);
      UVar1 = UnicodeSet::contains(this,(UnicodeString *)local_1760);
      if (UVar1 == '\0') {
        pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
        PaddingMatcher::PaddingMatcher(&local_17b0,(UnicodeString *)local_1760);
        pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
        pPVar15 = PaddingMatcher::operator=(&(pNVar7->fLocalMatchers).padding,&local_17b0);
        (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                  (pNVar6,pPVar15);
        PaddingMatcher::~PaddingMatcher(&local_17b0);
      }
    }
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
              (pNVar6,&pNVar7->fLocalMatchers);
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    DecimalMatcher::DecimalMatcher
              (&local_1878,symbols,(Grouper *)local_9e8,
               parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr._4_4_);
    pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    pDVar16 = DecimalMatcher::operator=(&(pNVar7->fLocalMatchers).decimal,&local_1878);
    (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pDVar16);
    DecimalMatcher::~DecimalMatcher(&local_1878);
    if (((properties->parseNoExponent & 1U) == 0) || (0 < properties->minimumExponentDigits)) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      ScientificMatcher::ScientificMatcher(&local_1a08,symbols,(Grouper *)local_9e8);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pSVar17 = ScientificMatcher::operator=(&(pNVar7->fLocalMatchers).scientific,&local_1a08);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pSVar17);
      ScientificMatcher::~ScientificMatcher(&local_1a08);
    }
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    local_1a10._vptr_NumberParseMatcher = (_func_int **)0x0;
    RequireNumberValidator::RequireNumberValidator((RequireNumberValidator *)&local_1a10);
    pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    pRVar18 = RequireNumberValidator::operator=
                        (&(pNVar7->fLocalValidators).number,(RequireNumberValidator *)&local_1a10);
    (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pRVar18);
    RequireNumberValidator::~RequireNumberValidator((RequireNumberValidator *)&local_1a10);
    if ((grouper._7_1_ & 1) != 0) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      local_1a18._vptr_NumberParseMatcher = (_func_int **)0x0;
      RequireAffixValidator::RequireAffixValidator((RequireAffixValidator *)&local_1a18);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pRVar19 = RequireAffixValidator::operator=
                          (&(pNVar7->fLocalValidators).affix,(RequireAffixValidator *)&local_1a18);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pRVar19);
      RequireAffixValidator::~RequireAffixValidator((RequireAffixValidator *)&local_1a18);
    }
    if (parseCurrency) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      NStack_1a20._vptr_NumberParseMatcher = (_func_int **)0x0;
      RequireCurrencyValidator::RequireCurrencyValidator
                ((RequireCurrencyValidator *)&stack0xffffffffffffe5e0);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pRVar20 = RequireCurrencyValidator::operator=
                          (&(pNVar7->fLocalValidators).currency,
                           (RequireCurrencyValidator *)&stack0xffffffffffffe5e0);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pRVar20);
      RequireCurrencyValidator::~RequireCurrencyValidator
                ((RequireCurrencyValidator *)&stack0xffffffffffffe5e0);
    }
    if ((properties->decimalPatternMatchRequired & 1U) != 0) {
      local_1c39 = true;
      if ((properties->decimalSeparatorAlwaysShown & 1U) == 0) {
        local_1c39 = properties->maximumFractionDigits != 0;
      }
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      RequireDecimalSeparatorValidator::RequireDecimalSeparatorValidator
                ((RequireDecimalSeparatorValidator *)&multiplier.fError,local_1c39);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pRVar21 = RequireDecimalSeparatorValidator::operator=
                          (&(pNVar7->fLocalValidators).decimalSeparator,
                           (RequireDecimalSeparatorValidator *)&multiplier.fError);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pRVar21);
      RequireDecimalSeparatorValidator::~RequireDecimalSeparatorValidator
                ((RequireDecimalSeparatorValidator *)&multiplier.fError);
    }
    icu_63::number::impl::scaleFromProperties((Scale *)local_1a50,properties);
    bVar2 = icu_63::number::Scale::isValid((Scale *)local_1a50);
    if (bVar2) {
      pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      icu_63::number::Scale::Scale(&local_1a88,(Scale *)local_1a50);
      MultiplierParseHandler::MultiplierParseHandler(&local_1a70,&local_1a88);
      pNVar7 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
      pMVar22 = MultiplierParseHandler::operator=
                          (&(pNVar7->fLocalValidators).multiplier,&local_1a70);
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar6,pMVar22);
      MultiplierParseHandler::~MultiplierParseHandler(&local_1a70);
      icu_63::number::Scale::~Scale(&local_1a88);
    }
    pNVar6 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_a08);
    freeze(pNVar6);
    properties_local =
         (DecimalFormatProperties *)
         LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::orphan(&local_a08);
    icu_63::number::Scale::~Scale((Scale *)local_1a50);
    UnicodeString::~UnicodeString((UnicodeString *)local_1760);
    LocalPointer<icu_63::numparse::impl::NumberParserImpl>::~LocalPointer
              ((LocalPointer<icu_63::numparse::impl::NumberParserImpl> *)&local_a08);
    GVar23.fStrategy._0_2_ = grouper.fGrouping1;
    GVar23.fStrategy._2_2_ = grouper.fGrouping2;
    GVar23.fGrouping1 = local_9e8._0_2_;
    GVar23.fGrouping2 = local_9e8._2_2_;
    GVar23.fMinGrouping = local_9e8._4_2_;
    GVar23._6_2_ = local_9e8._6_2_;
  }
  grouper._0_4_ = GVar23.fStrategy;
  local_9e8 = GVar23._0_8_;
  icu_63::number::impl::CurrencySymbols::~CurrencySymbols((CurrencySymbols *)local_9b8);
  CurrencyUnit::~CurrencyUnit
            ((CurrencyUnit *)((long)&currencySymbols.fIntlCurrencySymbol.fUnion + 0x30));
LAB_002fcef8:
  icu_63::number::impl::CurrencyPluralInfoAffixProvider::~CurrencyPluralInfoAffixProvider
            ((CurrencyPluralInfoAffixProvider *)&affixProvider);
  icu_63::number::impl::PropertiesAffixPatternProvider::~PropertiesAffixPatternProvider
            ((PropertiesAffixPatternProvider *)local_220);
  Locale::~Locale((Locale *)&localPAPP.fBogus);
  return (NumberParserImpl *)properties_local;
}

Assistant:

NumberParserImpl*
NumberParserImpl::createParserFromProperties(const number::impl::DecimalFormatProperties& properties,
                                             const DecimalFormatSymbols& symbols, bool parseCurrency,
                                             UErrorCode& status) {
    Locale locale = symbols.getLocale();
    PropertiesAffixPatternProvider localPAPP;
    CurrencyPluralInfoAffixProvider localCPIAP;
    AffixPatternProvider* affixProvider;
    if (properties.currencyPluralInfo.fPtr.isNull()) {
        localPAPP.setTo(properties, status);
        affixProvider = &localPAPP;
    } else {
        localCPIAP.setTo(*properties.currencyPluralInfo.fPtr, properties, status);
        affixProvider = &localCPIAP;
    }
    if (affixProvider == nullptr || U_FAILURE(status)) { return nullptr; }
    CurrencyUnit currency = resolveCurrency(properties, locale, status);
    CurrencySymbols currencySymbols(currency, locale, symbols, status);
    bool isStrict = properties.parseMode.getOrDefault(PARSE_MODE_STRICT) == PARSE_MODE_STRICT;
    Grouper grouper = Grouper::forProperties(properties);
    int parseFlags = 0;
    if (affixProvider == nullptr || U_FAILURE(status)) { return nullptr; }
    if (!properties.parseCaseSensitive) {
        parseFlags |= PARSE_FLAG_IGNORE_CASE;
    }
    if (properties.parseIntegerOnly) {
        parseFlags |= PARSE_FLAG_INTEGER_ONLY;
    }
    if (properties.signAlwaysShown) {
        parseFlags |= PARSE_FLAG_PLUS_SIGN_ALLOWED;
    }
    if (isStrict) {
        parseFlags |= PARSE_FLAG_STRICT_GROUPING_SIZE;
        parseFlags |= PARSE_FLAG_STRICT_SEPARATORS;
        parseFlags |= PARSE_FLAG_USE_FULL_AFFIXES;
        parseFlags |= PARSE_FLAG_EXACT_AFFIX;
    } else {
        parseFlags |= PARSE_FLAG_INCLUDE_UNPAIRED_AFFIXES;
    }
    if (grouper.getPrimary() <= 0) {
        parseFlags |= PARSE_FLAG_GROUPING_DISABLED;
    }
    if (parseCurrency || affixProvider->hasCurrencySign()) {
        parseFlags |= PARSE_FLAG_MONETARY_SEPARATORS;
    }
    if (!parseCurrency) {
        parseFlags |= PARSE_FLAG_NO_FOREIGN_CURRENCY;
    }

    LocalPointer<NumberParserImpl> parser(new NumberParserImpl(parseFlags));

    parser->fLocalMatchers.ignorables = {
            isStrict ? unisets::STRICT_IGNORABLES : unisets::DEFAULT_IGNORABLES};
    IgnorablesMatcher& ignorables = parser->fLocalMatchers.ignorables;

    //////////////////////
    /// AFFIX MATCHERS ///
    //////////////////////

    // The following statements set up the affix matchers.
    AffixTokenMatcherSetupData affixSetupData = {
            currencySymbols, symbols, ignorables, locale, parseFlags};
    parser->fLocalMatchers.affixTokenMatcherWarehouse = {&affixSetupData};
    parser->fLocalMatchers.affixMatcherWarehouse = {&parser->fLocalMatchers.affixTokenMatcherWarehouse};
    parser->fLocalMatchers.affixMatcherWarehouse.createAffixMatchers(
            *affixProvider, *parser, ignorables, parseFlags, status);

    ////////////////////////
    /// CURRENCY MATCHER ///
    ////////////////////////

    if (parseCurrency || affixProvider->hasCurrencySign()) {
        parser->addMatcher(parser->fLocalMatchers.currency = {currencySymbols, symbols, parseFlags, status});
    }

    ///////////////
    /// PERCENT ///
    ///////////////

    // ICU-TC meeting, April 11, 2018: accept percent/permille only if it is in the pattern,
    // and to maintain regressive behavior, divide by 100 even if no percent sign is present.
    if (!isStrict && affixProvider->containsSymbolType(AffixPatternType::TYPE_PERCENT, status)) {
        parser->addMatcher(parser->fLocalMatchers.percent = {symbols});
    }
    if (!isStrict && affixProvider->containsSymbolType(AffixPatternType::TYPE_PERMILLE, status)) {
        parser->addMatcher(parser->fLocalMatchers.permille = {symbols});
    }

    ///////////////////////////////
    /// OTHER STANDARD MATCHERS ///
    ///////////////////////////////

    if (!isStrict) {
        parser->addMatcher(parser->fLocalMatchers.plusSign = {symbols, false});
        parser->addMatcher(parser->fLocalMatchers.minusSign = {symbols, false});
    }
    parser->addMatcher(parser->fLocalMatchers.nan = {symbols});
    parser->addMatcher(parser->fLocalMatchers.infinity = {symbols});
    UnicodeString padString = properties.padString;
    if (!padString.isBogus() && !ignorables.getSet()->contains(padString)) {
        parser->addMatcher(parser->fLocalMatchers.padding = {padString});
    }
    parser->addMatcher(parser->fLocalMatchers.ignorables);
    parser->addMatcher(parser->fLocalMatchers.decimal = {symbols, grouper, parseFlags});
    // NOTE: parseNoExponent doesn't disable scientific parsing if we have a scientific formatter
    if (!properties.parseNoExponent || properties.minimumExponentDigits > 0) {
        parser->addMatcher(parser->fLocalMatchers.scientific = {symbols, grouper});
    }

    //////////////////
    /// VALIDATORS ///
    //////////////////

    parser->addMatcher(parser->fLocalValidators.number = {});
    if (isStrict) {
        parser->addMatcher(parser->fLocalValidators.affix = {});
    }
    if (parseCurrency) {
        parser->addMatcher(parser->fLocalValidators.currency = {});
    }
    if (properties.decimalPatternMatchRequired) {
        bool patternHasDecimalSeparator =
                properties.decimalSeparatorAlwaysShown || properties.maximumFractionDigits != 0;
        parser->addMatcher(parser->fLocalValidators.decimalSeparator = {patternHasDecimalSeparator});
    }
    // The multiplier takes care of scaling percentages.
    Scale multiplier = scaleFromProperties(properties);
    if (multiplier.isValid()) {
        parser->addMatcher(parser->fLocalValidators.multiplier = {multiplier});
    }

    parser->freeze();
    return parser.orphan();
}